

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O0

void __thiscall jaegertracing::SpanContext::swap(SpanContext *this,SpanContext *ctx)

{
  SpanContext *ctx_local;
  SpanContext *this_local;
  
  std::swap<jaegertracing::TraceID>(&this->_traceID,&ctx->_traceID);
  std::swap<unsigned_long>(&this->_spanID,&ctx->_spanID);
  std::swap<unsigned_long>(&this->_parentID,&ctx->_parentID);
  std::swap<unsigned_char>(&this->_flags,&ctx->_flags);
  std::
  swap<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            (&this->_baggage,&ctx->_baggage);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(&this->_debugID,&ctx->_debugID);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(&this->_traceState,&ctx->_traceState);
  return;
}

Assistant:

void swap(SpanContext& ctx)
    {
        using std::swap;
        swap(_traceID, ctx._traceID);
        swap(_spanID, ctx._spanID);
        swap(_parentID, ctx._parentID);
        swap(_flags, ctx._flags);
        swap(_baggage, ctx._baggage);
        swap(_debugID, ctx._debugID);
        swap(_traceState, ctx._traceState);
    }